

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocaleData::unsLongLongToString
          (QString *__return_storage_ptr__,QLocaleData *this,qulonglong l,int precision,int base,
          int width,uint flags)

{
  long in_FS_OFFSET;
  QStringView zero;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  zeroDigit((QString *)&local_58,this);
  if (base == 10) {
    local_78.d = local_58.d;
    local_78.ptr = local_58.ptr;
    local_78.size = local_58.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_78.d = (Data *)0x0;
    local_90.d = (Data *)0x0;
    local_90.ptr = (char16_t *)0x0;
    local_78.ptr = L"0";
    local_90.size = 0;
    local_78.size = 1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  }
  if (l == 0) {
    local_90.d = local_78.d;
    local_90.ptr = local_78.ptr;
    local_90.size = local_78.size;
    if (local_78.d != (Data *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    zero.m_data = local_58.ptr;
    zero.m_size = local_58.size;
    qulltoa((QString *)&local_90,l,base,zero);
  }
  applyIntegerFormatting
            (__return_storage_ptr__,this,(QString *)&local_90,false,precision,base,width,flags);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocaleData::unsLongLongToString(qulonglong l, int precision,
                                         int base, int width, unsigned flags) const
{
    const QString zero = zeroDigit();
    QString resultZero = base == 10 ? zero : QStringLiteral("0");
    return applyIntegerFormatting(l ? qulltoa(l, base, zero) : resultZero,
                                  false, precision, base, width, flags);
}